

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O2

void fill_cache(cacheblock_t *cache,size_t N,size_t depth)

{
  size_t i;
  size_t sVar1;
  long lVar2;
  cacheblock_t *pcVar3;
  cacheblock_t *pcVar4;
  long lVar5;
  bool bVar6;
  
  pcVar3 = cache;
  for (sVar1 = 0; sVar1 != N; sVar1 = sVar1 + 1) {
    lVar5 = 4;
    pcVar4 = pcVar3;
    for (lVar2 = 0; (lVar2 != 4 && (cache[sVar1].ptr[lVar2 + depth] != '\0')); lVar2 = lVar2 + 1) {
      pcVar3->bytes[lVar2] = cache[sVar1].ptr[lVar2 + depth];
      lVar5 = lVar5 + -1;
      pcVar4 = (cacheblock_t *)(pcVar4->bytes + 1);
    }
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      pcVar4->bytes[0] = '\0';
      pcVar4 = (cacheblock_t *)(pcVar4->bytes + 1);
    }
    pcVar3 = pcVar3 + 1;
  }
  return;
}

Assistant:

static void
fill_cache(cacheblock_t* cache, size_t N, size_t depth)
{
	for (size_t i=0; i < N; ++i) {
		unsigned int j=0;
		while (j < CACHED_BYTES && cache[i].ptr[depth+j]) {
			cache[i].bytes[j] = cache[i].ptr[depth+j];
			++j;
		}
		while (j < CACHED_BYTES) {
			cache[i].bytes[j] = 0;
			++j;
		}
	}
}